

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ising_polynomial_model.hpp
# Opt level: O1

void __thiscall
openjij::test::Graph_IsingPolynomialModel_1_Test::TestBody(Graph_IsingPolynomialModel_1_Test *this)

{
  pointer *ppvVar1;
  int *piVar2;
  pointer piVar3;
  ValueType VVar4;
  long *plVar5;
  undefined8 *puVar6;
  void *pvVar7;
  const_iterator cVar8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  long lVar10;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *p_Var11;
  __node_base_ptr *pp_Var12;
  string *psVar13;
  undefined8 uVar14;
  char *pcVar15;
  string *psVar16;
  string *psVar17;
  string *psVar18;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var19;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_00;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_04;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_05;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_06;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_07;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_08;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_09;
  initializer_list<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>
  __l_10;
  initializer_list<double> __l_11;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_12;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_13;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  __l_14;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_15;
  initializer_list<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_16;
  initializer_list<signed_char> __l_17;
  initializer_list<signed_char> __l_18;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  IPM bpm;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_2;
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  key_list;
  vector<double,_std::allocator<double>_> value_list;
  allocator_type local_5e1;
  undefined1 local_5e0 [16];
  undefined8 auStack_5d0 [2];
  byte local_5c0;
  undefined1 *local_5b8 [2];
  undefined1 local_5a8 [16];
  undefined1 local_598;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_590;
  undefined1 local_570;
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  undefined1 local_548;
  undefined7 uStack_547;
  undefined4 auStack_540 [2];
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  local_538;
  undefined1 local_520 [8];
  pointer local_518;
  undefined1 local_508 [40];
  undefined8 uStack_4e0;
  undefined1 local_4d0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_4c8;
  undefined1 local_4a8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_498;
  undefined1 local_478;
  pointer local_470;
  pointer local_468;
  pointer apvStack_460 [2];
  undefined1 local_450;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_448;
  undefined1 local_428;
  allocator_type local_413;
  allocator_type local_412;
  allocator_type local_411;
  allocator_type local_410;
  allocator_type local_40f;
  allocator_type local_40e;
  allocator_type local_40d;
  allocator_type local_40c;
  allocator_type local_40b;
  allocator_type local_40a;
  allocator_type local_409;
  undefined1 local_408 [32];
  _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_3e8;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  local_3b0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_398;
  double local_380;
  double local_378;
  undefined1 local_368 [32];
  __index_type local_348;
  undefined1 *local_340 [2];
  undefined1 local_330 [16];
  undefined1 local_320;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_318;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f8;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b8;
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_298;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  undefined1 local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  __index_type local_208;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_200;
  undefined1 local_1e0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1d8;
  undefined1 local_1b8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1b0;
  undefined1 local_190;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_188;
  undefined1 local_168;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_160;
  undefined1 local_140;
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  local_138;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  undefined1 local_100;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  undefined1 local_d8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined1 local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 local_88;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  undefined1 local_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 local_38;
  
  local_408._0_4_ = 1;
  local_3e8._M_buckets._0_1_ = '\0';
  local_3e8._M_bucket_count._0_4_ = 1;
  local_3e8._M_rehash_policy._M_next_resize._0_1_ = 0;
  local_3e8._M_single_bucket._0_4_ = 1;
  local_398.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  __l._M_len = 3;
  __l._M_array = (iterator)local_408;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)local_568,__l,&local_409);
  local_5e0._0_8_ = auStack_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e0,"a","");
  local_5c0 = '\x01';
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"a","");
  local_598 = 1;
  local_590._0_8_ = (long)&local_590 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"a","");
  local_570 = 1;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_5e0;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)(local_558 + 8),__l_00,&local_40a);
  local_120._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_100 = 0;
  local_f8._0_8_ = (long)&local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"b","");
  local_d8 = 1;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_120;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_298,__l_01,&local_40b);
  local_498._0_8_ =
       local_298.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_498._8_8_ =
       local_298.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_498._16_8_ =
       local_298.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_298.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478 = 2;
  psVar18 = (string *)local_340;
  local_368._0_4_ = 2;
  local_348 = '\0';
  local_340[0] = local_330;
  std::__cxx11::string::_M_construct<char_const*>(psVar18,"b","");
  local_320 = 1;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_368;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2b8,__l_02,&local_40c);
  local_470 = local_2b8.
              super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_468 = local_2b8.
              super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  apvStack_460[0] =
       local_2b8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_450 = 2;
  psVar16 = (string *)local_250;
  local_278._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_258 = 0;
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>(psVar16,"b","");
  local_230 = 1;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&local_278;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2d8,__l_03,&local_40d);
  local_448._0_8_ =
       local_2d8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_448._8_8_ =
       local_2d8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_448._16_8_ =
       local_2d8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2d8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428 = 2;
  __l_04._M_len = 3;
  __l_04._M_array = (iterator)&local_498;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector(&local_538,__l_04,&local_40e);
  local_1d8._M_first._M_storage = (_Uninitialized<int,_true>)1;
  local_1b8 = 0;
  local_1b0._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_190 = 0;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_1d8;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)local_520,__l_05,&local_40f);
  local_228._0_8_ = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_228,"a","");
  local_208 = '\x01';
  local_200._M_first._M_storage = (_Uninitialized<int,_true>)1;
  local_1e0 = 0;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_228;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)local_508,__l_06,&local_410);
  psVar13 = (string *)local_58;
  local_80._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_60 = 0;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>(psVar13,"b","");
  local_38 = 1;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_80;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2f8,__l_07,&local_411);
  local_188._0_8_ =
       local_2f8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_188._8_8_ =
       local_2f8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_188._16_8_ =
       local_2f8.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2f8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168 = 2;
  psVar17 = (string *)local_a8;
  local_d0._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_b0 = 0;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>(psVar17,"a","");
  local_88 = 1;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_d0;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_318,__l_08,&local_412);
  local_160._0_8_ =
       local_318.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_160._8_8_ =
       local_318.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_160._16_8_ =
       local_318.
       super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_318.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140 = 2;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)&local_188;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)(local_508 + 0x18),__l_09,&local_5e1);
  __l_10._M_len = 6;
  __l_10._M_array = (iterator)local_568;
  std::
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  ::vector(&local_138,__l_10,&local_413);
  lVar10 = 0x78;
  do {
    std::
    vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
               *)(local_568 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  lVar10 = -0x50;
  p_Var11 = &local_160;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)&local_5e1,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_318);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar17[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_5e1,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar17);
    psVar17[0x20] = (string)0xff;
    psVar17 = psVar17 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2f8);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar13[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_d0,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar13);
    psVar13[0x20] = (string)0xff;
    psVar13 = psVar13 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x50;
  p_Var11 = &local_200;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)&local_188,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x50;
  p_Var11 = &local_1b0;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)local_228,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x78;
  p_Var11 = &local_448;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)&local_1d8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2d8);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar16[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_1d8,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar16);
    psVar16[0x20] = (string)0xff;
    psVar16 = psVar16 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2b8);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar18[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_278,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar18);
    psVar18[0x20] = (string)0xff;
    psVar18 = psVar18 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_298);
  lVar10 = -0x50;
  p_Var19 = &local_f8;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var19->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)local_368,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&p_Var19->_M_first);
    *(undefined1 *)&(&p_Var19->_M_first)[8]._M_storage = 0xff;
    p_Var19 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)p_Var19 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x78;
  p_Var11 = &local_590;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[*(byte *)(&p_Var11->_M_first + 8)]._M_data)
              ((anon_class_1_0_00000001 *)&local_498,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(__index_type *)(&p_Var11->_M_first + 8) = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  lVar10 = -0x78;
  pp_Var12 = &local_3e8._M_single_bucket;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[*(byte *)(pp_Var12 + 4)]._M_data)
              ((anon_class_1_0_00000001 *)local_5e0,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)pp_Var12);
    *(__index_type *)(pp_Var12 + 4) = 0xff;
    pp_Var12 = pp_Var12 + -5;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  _local_548 = 0xbff8000000000000;
  auStack_540[0] = 0;
  auStack_540[1] = 0xc0040000;
  local_558._0_8_ = (pointer)0x4008000000000000;
  local_558._8_8_ = 0xbff0000000000000;
  local_568._0_8_ = (pointer)0x4010000000000000;
  local_568._8_8_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4000000000000000;
  __l_11._M_len = 6;
  __l_11._M_array = (iterator)local_568;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_120._M_first,__l_11,
             (allocator_type *)local_408);
  graph::IsingPolynomialModel<double>::IsingPolynomialModel
            ((IsingPolynomialModel<double> *)local_408,&local_138,
             (vector<double,_std::allocator<double>_> *)&local_120._M_first);
  local_5e0._0_4_ = local_408._0_4_;
  local_498._M_first._M_storage = (_Uninitialized<int,_true>)2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_568,"bpm.GetDegree()","2",(int *)local_5e0,
             &local_498._M_first._M_storage);
  if ((internal)local_568[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_5e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_568._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x2e,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
    if ((long *)local_5e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_5e0._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_568 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_568._8_8_);
  }
  local_5e0._0_4_ = (int)((ulong)(local_408._16_8_ - local_408._8_8_) >> 3) * -0x33333333;
  local_498._M_first._M_storage = (_Uninitialized<int,_true>)5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_568,"bpm.GetSystemSize()","5",(int *)local_5e0,
             &local_498._M_first._M_storage);
  if ((internal)local_568[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_5e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_568._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x2f,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
    if ((long *)local_5e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_5e0._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_568 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_568._8_8_);
  }
  local_568._0_4_ = 1;
  _local_548 = _local_548 & 0xffffffffffffff00;
  auStack_540[0] = 2;
  local_520[0] = 0;
  local_518 = (pointer)local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_520 + 8),"a","");
  local_508[0x10] = 1;
  psVar18 = (string *)local_5b8;
  local_5e0._0_4_ = 2;
  local_5c0 = '\0';
  local_5b8[0] = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>(psVar18,"a","");
  local_598 = 1;
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)local_5e0;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_278._M_first,__l_12,(allocator_type *)&local_80._M_first);
  local_508._24_8_ = local_278._0_8_;
  local_508._32_8_ = local_278._8_8_;
  uStack_4e0 = local_278._16_8_;
  local_278._0_8_ = 0;
  local_278._8_8_ = 0;
  local_278._16_8_ = 0;
  local_4d0 = 2;
  psVar16 = (string *)&local_470;
  local_498._M_first._M_storage = (_Uninitialized<int,_true>)2;
  local_478 = 0;
  local_470 = (pointer)apvStack_460;
  std::__cxx11::string::_M_construct<char_const*>(psVar16,"b","");
  local_450 = 1;
  __l_13._M_len = 2;
  __l_13._M_array = (iterator)&local_498;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_1d8._M_first,__l_13,(allocator_type *)&local_d0._M_first);
  local_4c8._0_8_ = local_1d8._0_8_;
  local_4c8._8_8_ = local_1d8._8_8_;
  local_4c8._16_8_ = local_1d8._16_8_;
  local_1d8._0_8_ = 0;
  local_1d8._8_8_ = 0;
  local_1d8._16_8_ = 0;
  local_4a8 = 2;
  __l_14._M_len = 5;
  __l_14._M_array = (iterator)local_568;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
            *)local_368,__l_14,(allocator_type *)&local_188._M_first);
  testing::internal::
  CmpHelperEQ<std::vector<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>,std::allocator<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>>>,std::vector<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>,std::allocator<std::variant<int,std::__cxx11::string,std::vector<std::variant<int,std::__cxx11::string>,std::allocator<std::variant<int,std::__cxx11::string>>>>>>>
            ((internal *)local_228,"bpm.GetIndexList()",
             "(std::vector<IPM::IndexType>{1, 2, \"a\", Tup{2, \"a\"}, Tup{2, \"b\"}})",
             (vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)(local_408 + 8),
             (vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
              *)local_368);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             *)local_368);
  lVar10 = -200;
  p_Var11 = &local_4c8;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
      ::_S_vtable._M_arr[(byte)(&p_Var11->_M_first)[8]._M_storage]._M_data)
              ((anon_class_1_0_00000001 *)&local_188,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&p_Var11->_M_first);
    *(undefined1 *)&(&p_Var11->_M_first)[8]._M_storage = 0xff;
    p_Var11 = (_Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)((long)p_Var11 + -0x28);
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_1d8._M_first);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar16[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_188,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar16);
    psVar16[0x20] = (string)0xff;
    psVar16 = psVar16 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_278._M_first);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar18[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_498,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar18);
    psVar18[0x20] = (string)0xff;
    psVar18 = psVar18 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  if ((string)local_228[0] == (string)0x0) {
    testing::Message::Message((Message *)local_568);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_228._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x31,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_5e0,(Message *)local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
    if ((pointer)local_568._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_568._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_228 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_228._8_8_);
  }
  local_5e0._0_8_ = local_3e8._M_element_count;
  local_498._M_first._M_storage = (_Uninitialized<int,_true>)5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_568,"bpm.GetIndexMap().size()","5",(unsigned_long *)local_5e0,
             &local_498._M_first._M_storage);
  if ((internal)local_568[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_5e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_568._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x32,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
    if ((long *)local_5e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_5e0._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_568 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_568._8_8_);
  }
  local_568._0_4_ = 1;
  _local_548 = _local_548 & 0xffffffffffffff00;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3e8,(key_type *)local_568);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) goto LAB_0013839e;
  local_498._0_8_ = local_498._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_5e0,"bpm.GetIndexMap().at(1)","0",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_498._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[_local_548 & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_498,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_568);
  if ((string)local_5e0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_568);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_5e0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x33,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_498._M_first,(Message *)local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
    if ((pointer)local_568._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_568._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_5e0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5e0._8_8_);
  }
  local_568._0_4_ = 2;
  _local_548 = _local_548 & 0xffffffffffffff00;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3e8,(key_type *)local_568);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_498._M_first._M_storage = (_Uninitialized<int,_true>)1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_5e0,"bpm.GetIndexMap().at(2)","1",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_498._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[_local_548 & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_498,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_568);
  if ((string)local_5e0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_568);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_5e0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x34,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_498._M_first,(Message *)local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
    if ((pointer)local_568._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_568._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_5e0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5e0._8_8_);
  }
  local_568._0_8_ = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"a","");
  local_548 = 1;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3e8,(key_type *)local_568);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_498._M_first._M_storage = (_Uninitialized<int,_true>)2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_5e0,"bpm.GetIndexMap().at(\"a\")","2",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_498._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[_local_548 & 0xff]._M_data)
            ((anon_class_1_0_00000001 *)&local_498,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_568);
  if ((string)local_5e0[0] == (string)0x0) {
    testing::Message::Message((Message *)local_568);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_5e0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x35,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_498._M_first,(Message *)local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
    if ((pointer)local_568._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_568._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_5e0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5e0._8_8_);
  }
  psVar18 = (string *)auStack_540;
  local_568._0_4_ = 2;
  _local_548 = _local_548 & 0xffffffffffffff00;
  ppvVar1 = &local_538.
             super__Vector_base<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  auStack_540 = (undefined4  [2])ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>(psVar18,"a","");
  local_520[0] = 1;
  __l_15._M_len = 2;
  __l_15._M_array = (iterator)local_568;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_498._M_first,__l_15,(allocator_type *)&local_1d8._M_first);
  local_5e0._0_8_ = local_498._0_8_;
  local_5e0._8_8_ = local_498._8_8_;
  auStack_5d0[0] = local_498._16_8_;
  local_498._0_8_ = 0;
  local_498._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_498._16_8_ = 0;
  local_5c0 = 2;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3e8,(key_type *)local_5e0);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_278._M_first._M_storage = (_Uninitialized<int,_true>)3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_368,"bpm.GetIndexMap().at(Tup{2, \"a\"})","3",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_278._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[local_5c0]._M_data)
            ((anon_class_1_0_00000001 *)&local_278,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_5e0);
  local_5c0 = 0xff;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_498._M_first);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar18[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_278,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar18);
    psVar18[0x20] = (string)0xff;
    psVar18 = psVar18 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  if (local_368[0] == '\0') {
    testing::Message::Message((Message *)local_568);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_368._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x36,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_5e0,(Message *)local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
    if ((pointer)local_568._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_568._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_368 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_368._8_8_);
  }
  psVar18 = (string *)auStack_540;
  local_568._0_4_ = 2;
  _local_548 = _local_548 & 0xffffffffffffff00;
  auStack_540 = (undefined4  [2])ppvVar1;
  std::__cxx11::string::_M_construct<char_const*>(psVar18,"b","");
  local_520[0] = 1;
  __l_16._M_len = 2;
  __l_16._M_array = (iterator)local_568;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&local_498._M_first,__l_16,(allocator_type *)&local_1d8._M_first);
  local_5e0._0_8_ = local_498._0_8_;
  local_5e0._8_8_ = local_498._8_8_;
  auStack_5d0[0] = local_498._16_8_;
  local_498._0_8_ = 0;
  local_498._8_8_ = (pointer)0x0;
  local_498._16_8_ = (pointer)0x0;
  local_5c0 = 2;
  cVar8 = std::
          _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&local_3e8,(key_type *)local_5e0);
  if (cVar8.
      super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  local_278._M_first._M_storage = (_Uninitialized<int,_true>)4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_368,"bpm.GetIndexMap().at(Tup{2, \"b\"})","4",
             (int *)((long)cVar8.
                           super__Node_iterator_base<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_true>
                           ._M_cur + 0x30),&local_278._M_first._M_storage);
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_&>
    ::_S_vtable._M_arr[local_5c0]._M_data)
            ((anon_class_1_0_00000001 *)&local_278,
             (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_5e0);
  local_5c0 = 0xff;
  std::
  vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&local_498._M_first);
  lVar10 = -0x50;
  do {
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[(byte)psVar18[0x20]]._M_data)
              ((anon_class_1_0_00000001 *)&local_278,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)psVar18);
    psVar18[0x20] = (string)0xff;
    psVar18 = psVar18 + -0x28;
    lVar10 = lVar10 + 0x28;
  } while (lVar10 != 0);
  if (local_368[0] == '\0') {
    testing::Message::Message((Message *)local_568);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_368._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_5e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x37,pcVar15);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_5e0,(Message *)local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5e0);
    if ((pointer)local_568._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_568._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_368 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_368._8_8_);
  }
  local_5e0._0_8_ =
       (long)local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  local_498._M_first._M_storage = (_Uninitialized<int,_true>)6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_568,"bpm.GetKeyValueList().size()","6",(unsigned_long *)local_5e0,
             &local_498._M_first._M_storage);
  if ((internal)local_568[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_5e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar15 = "";
    }
    else {
      pcVar15 = *(char **)local_568._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
               ,0x39,pcVar15);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
    if ((long *)local_5e0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_5e0._0_8_ + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_568 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_568._8_8_);
  }
  if (local_3b0.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_3b0.
      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_001383ec:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_001383ff:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_00138412:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
LAB_00138425:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
LAB_00138438:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5);
LAB_0013844b:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_0013845d:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_00138470:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
LAB_00138483:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
LAB_00138496:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
LAB_001384a9:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",5);
    uVar9 = extraout_RDX;
LAB_001384bc:
    uVar14 = 1;
LAB_001384c7:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
    uVar9 = extraout_RDX_00;
LAB_001384d5:
    uVar14 = 2;
LAB_001384e0:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_001384ee:
    uVar14 = 2;
LAB_001384fa:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14);
    uVar9 = extraout_RDX_01;
LAB_00138508:
    uVar14 = 3;
LAB_00138513:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
    uVar9 = extraout_RDX_02;
LAB_00138521:
    uVar14 = 4;
LAB_0013852c:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_0013853a:
    uVar14 = 4;
LAB_00138546:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14);
    uVar9 = extraout_RDX_03;
LAB_00138554:
    uVar14 = 5;
LAB_0013855f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
    lVar10 = extraout_RDX_04;
LAB_0013856d:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
               (lVar10 >> 3) * (long)psVar18);
    lVar10 = extraout_RDX_05;
LAB_00138585:
    lVar10 = (lVar10 >> 3) * (long)psVar18;
LAB_00138591:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,lVar10)
    ;
    lVar10 = extraout_RDX_06;
LAB_001385a1:
    uVar9 = (lVar10 >> 3) * (long)psVar18;
    uVar14 = 0;
LAB_001385b2:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
    lVar10 = extraout_RDX_07;
LAB_001385c0:
    uVar9 = (lVar10 >> 3) * (long)psVar18;
    uVar14 = 0;
LAB_001385d1:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_001385df:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
    uVar9 = extraout_RDX_08;
LAB_001385f2:
    uVar14 = 1;
LAB_001385fd:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_0013860b:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",2);
    uVar9 = extraout_RDX_09;
LAB_0013861e:
    uVar14 = 2;
LAB_00138629:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_00138637:
    uVar14 = 2;
LAB_00138643:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14);
LAB_00138651:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",3);
    uVar9 = extraout_RDX_10;
LAB_00138664:
    uVar14 = 3;
LAB_0013866f:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
LAB_0013867d:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",4);
    uVar9 = extraout_RDX_11;
LAB_00138690:
    uVar14 = 4;
LAB_0013869b:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar14,
               uVar9);
  }
  else {
    local_5e0._0_8_ =
         (long)((local_3b0.
                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)((local_3b0.
                 super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->first).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(0).first.size()","1",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3a,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_001383ec;
    local_5e0._0_8_ =
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(1).first.size()","2",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3b,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 3) goto LAB_001383ff;
    local_5e0._0_8_ =
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(2).first.size()","2",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3c,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 4) goto LAB_00138412;
    local_5e0._0_8_ =
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(3).first.size()","1",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3d,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 5) goto LAB_00138425;
    local_5e0._0_8_ =
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[4].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[4].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(4).first.size()","2",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3e,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 6) goto LAB_00138438;
    local_5e0._0_8_ =
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[5].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish -
         (long)local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[5].first.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start >> 2;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(5).first.size()","1",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x3f,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if (local_3b0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_3b0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_0013844b;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_568,"bpm.GetKeyValueList().at(0).second","+4.0",
               (local_3b0.
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->second,4.0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x41,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_0013845d;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_568,"bpm.GetKeyValueList().at(1).second","-1.0",
               local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].second,-1.0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x42,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 3) goto LAB_00138470;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_568,"bpm.GetKeyValueList().at(2).second","-1.5",
               local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].second,-1.5);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x43,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 4) goto LAB_00138483;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_568,"bpm.GetKeyValueList().at(3).second","+2.0",
               local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].second,2.0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x44,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 5) goto LAB_00138496;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_568,"bpm.GetKeyValueList().at(4).second","-2.5",
               local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[4].second,-2.5);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x45,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 6) goto LAB_001384a9;
    testing::internal::CmpHelperFloatingPointEQ<double>
              ((internal *)local_568,"bpm.GetKeyValueList().at(5).second","+3.0",
               local_3b0.
               super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
               ._M_impl.super__Vector_impl_data._M_start[5].second,3.0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x46,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((local_3b0.
         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_finish ==
         local_3b0.
         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       (piVar2 = ((local_3b0.
                   super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->first).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,
       ((local_3b0.
         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->first).
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
       piVar2)) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      goto LAB_0013838b;
    }
    local_5e0._0_8_ = local_5e0._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(0).first.at(0)","0",piVar2,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x48,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    uVar9 = (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 2) goto LAB_001384bc;
    piVar2 = local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3b0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[1].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_001384c7;
    }
    local_5e0._0_8_ = local_5e0._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(1).first.at(0)","0",piVar2,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x49,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
LAB_0013838b:
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
LAB_0013839e:
      std::__throw_out_of_range("_Map_base::at");
    }
    piVar3 = local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].first.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar3 >> 2) < 2) goto LAB_0013838b;
    local_5e0._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(1).first.at(1)","1",piVar3 + 1,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4a,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    uVar9 = (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 3) goto LAB_001384d5;
    piVar2 = local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3b0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[2].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_001384e0;
    }
    local_5e0._0_8_ = local_5e0._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(2).first.at(0)","0",piVar2,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4b,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 3) goto LAB_001384ee;
    piVar3 = local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[2].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].first.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar3 >> 2) < 2) {
      uVar14 = 1;
      goto LAB_001384fa;
    }
    local_5e0._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(2).first.at(1)","2",piVar3 + 1,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4c,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    uVar9 = (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 4) goto LAB_00138508;
    piVar2 = local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[3].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3b0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[3].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00138513;
    }
    local_5e0._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(3).first.at(0)","2",piVar2,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4d,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    uVar9 = (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 5) goto LAB_00138521;
    piVar2 = local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3b0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[4].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_0013852c;
    }
    local_5e0._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(4).first.at(0)","3",piVar2,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4e,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 5) goto LAB_0013853a;
    piVar3 = local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[4].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)local_3b0.
                      super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[4].first.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar3 >> 2) < 2) {
      uVar14 = 1;
      goto LAB_00138546;
    }
    local_5e0._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(4).first.at(1)","4",piVar3 + 1,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x4f,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    uVar9 = (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_3b0.
                  super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar9 < 6) goto LAB_00138554;
    piVar2 = local_3b0.
             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5].first.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    if (local_3b0.
        super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start[5].first.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish ==
        piVar2) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_0013855f;
    }
    local_5e0._0_4_ = 4;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_568,"bpm.GetKeyValueList().at(5).first.at(0)","4",piVar2,
               (int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x50,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    psVar18 = (string *)0xaaaaaaaaaaaaaaab;
    local_5e0._0_8_ =
         ((long)local_398.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          CONCAT71(local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                   local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start._0_1_) >> 3) * -0x5555555555555555;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)5;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().size()","5",(unsigned_long *)local_5e0,
               &local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x52,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    plVar5 = (long *)CONCAT71(local_398.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_398.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
    lVar10 = (long)local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)plVar5;
    if (lVar10 == 0) goto LAB_0013856d;
    local_5e0._0_8_ = plVar5[1] - *plVar5 >> 3;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)3;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(0).size()","3",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x53,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    puVar6 = (undefined8 *)
             CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    lVar10 = (long)local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar6;
    if (lVar10 == 0) goto LAB_00138585;
    if ((unsigned_long *)puVar6[1] == (unsigned_long *)*puVar6) {
      lVar10 = 0;
      goto LAB_00138591;
    }
    local_5e0._0_8_ = local_5e0._0_8_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(0).at(0)","0",
               (unsigned_long *)*puVar6,(int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x54,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    plVar5 = (long *)CONCAT71(local_398.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_398.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
    lVar10 = (long)local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)plVar5;
    if (lVar10 == 0) goto LAB_001385a1;
    uVar9 = plVar5[1] - *plVar5 >> 3;
    if (uVar9 < 2) {
      uVar14 = 1;
      goto LAB_001385b2;
    }
    local_5e0._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(0).at(1)","1",
               (unsigned_long *)(*plVar5 + 8),(int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x55,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    plVar5 = (long *)CONCAT71(local_398.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_398.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
    lVar10 = (long)local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)plVar5;
    if (lVar10 == 0) goto LAB_001385c0;
    uVar9 = plVar5[1] - *plVar5 >> 3;
    if (uVar9 < 3) {
      uVar14 = 2;
      goto LAB_001385d1;
    }
    local_5e0._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(0).at(2)","2",
               (unsigned_long *)(*plVar5 + 0x10),(int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x56,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_398.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 2) goto LAB_001385df;
    local_5e0._0_8_ = *(long *)(lVar10 + 0x20) - *(long *)(lVar10 + 0x18) >> 3;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(1).size()","1",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x57,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar9 = ((long)local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) * -0x5555555555555555;
    if (uVar9 < 2) goto LAB_001385f2;
    if (*(unsigned_long **)(lVar10 + 0x20) == *(unsigned_long **)(lVar10 + 0x18)) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_001385fd;
    }
    local_5e0._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(1).at(0)","1",
               *(unsigned_long **)(lVar10 + 0x18),(int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x58,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_398.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 3) goto LAB_0013860b;
    local_5e0._0_8_ = *(long *)(lVar10 + 0x38) - *(long *)(lVar10 + 0x30) >> 3;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(2).size()","2",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x59,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar9 = ((long)local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) * -0x5555555555555555;
    if (uVar9 < 3) goto LAB_0013861e;
    if (*(unsigned_long **)(lVar10 + 0x38) == *(unsigned_long **)(lVar10 + 0x30)) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_00138629;
    }
    local_5e0._0_4_ = 2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(2).at(0)","2",
               *(unsigned_long **)(lVar10 + 0x30),(int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5a,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_398.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 3) goto LAB_00138637;
    if ((ulong)(*(long *)(lVar10 + 0x38) - *(long *)(lVar10 + 0x30) >> 3) < 2) {
      uVar14 = 1;
      goto LAB_00138643;
    }
    local_5e0._0_4_ = 3;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(2).at(1)","3",
               (unsigned_long *)(*(long *)(lVar10 + 0x30) + 8),(int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5b,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_398.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 4) goto LAB_00138651;
    local_5e0._0_8_ = *(long *)(lVar10 + 0x50) - *(long *)(lVar10 + 0x48) >> 3;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(3).size()","1",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5c,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar9 = ((long)local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) * -0x5555555555555555;
    if (uVar9 < 4) goto LAB_00138664;
    if (*(unsigned_long **)(lVar10 + 0x50) == *(unsigned_long **)(lVar10 + 0x48)) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_0013866f;
    }
    local_5e0._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(3).at(0)","4",
               *(unsigned_long **)(lVar10 + 0x48),(int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5d,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if ((ulong)(((long)local_398.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
               -0x5555555555555555) < 5) goto LAB_0013867d;
    local_5e0._0_8_ = *(long *)(lVar10 + 0x68) - *(long *)(lVar10 + 0x60) >> 3;
    local_498._M_first._M_storage = (_Uninitialized<int,_true>)2;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(4).size()","2",
               (unsigned_long *)local_5e0,&local_498._M_first._M_storage);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5e,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    uVar9 = ((long)local_398.
                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) * -0x5555555555555555;
    if (uVar9 < 5) goto LAB_00138690;
    if (*(unsigned_long **)(lVar10 + 0x68) == *(unsigned_long **)(lVar10 + 0x60)) {
      uVar14 = 0;
      uVar9 = 0;
      goto LAB_0013869b;
    }
    local_5e0._0_4_ = 4;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_568,"bpm.GetAdjacencyList().at(4).at(0)","4",
               *(unsigned_long **)(lVar10 + 0x60),(int *)local_5e0);
    if ((internal)local_568[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_5e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar15 = "";
      }
      else {
        pcVar15 = *(char **)local_568._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                 ,0x5f,pcVar15);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
      if ((long *)local_5e0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_5e0._0_8_ + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_568 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_568._8_8_);
    }
    lVar10 = CONCAT71(local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      local_398.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (4 < (ulong)(((long)local_398.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar10 >> 3) *
                   -0x5555555555555555)) {
      if (1 < (ulong)(*(long *)(lVar10 + 0x68) - *(long *)(lVar10 + 0x60) >> 3)) {
        local_5e0._0_4_ = 5;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)local_568,"bpm.GetAdjacencyList().at(4).at(1)","5",
                   (unsigned_long *)(*(long *)(lVar10 + 0x60) + 8),(int *)local_5e0);
        if ((internal)local_568[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_5e0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_568._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,0x60,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
          if ((long *)local_5e0._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_5e0._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_568 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_568._8_8_);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_568,"bpm.GetEstimatedMinEnergyDifference()","1.0*2",local_380,
                   2.0);
        if ((internal)local_568[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_5e0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_568._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,0x62,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
          if ((long *)local_5e0._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_5e0._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_568 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_568._8_8_);
        }
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_568,"bpm.GetEstimatedMaxEnergyDifference()","6.5*2",local_378,
                   13.0);
        if ((internal)local_568[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_5e0);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_568._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,99,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_498._M_first,(Message *)local_5e0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
          if ((long *)local_5e0._0_8_ != (long *)0x0) {
            (**(code **)(*(long *)local_5e0._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_568 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_568._8_8_);
        }
        local_498._0_5_ = 0x100000000;
        local_498._M_first._M_storage = (_Uninitialized<int,_true>)0x1010101;
        __l_17._M_len = 5;
        __l_17._M_array = (iterator)&local_498;
        std::vector<signed_char,_std::allocator<signed_char>_>::vector
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_568,__l_17,
                   (allocator_type *)local_368);
        VVar4 = graph::IsingPolynomialModel<double>::CalculateEnergy
                          ((IsingPolynomialModel<double> *)local_408,
                           (vector<signed_char,_std::allocator<signed_char>_> *)local_568);
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_5e0,
                   "bpm.CalculateEnergy((std::vector<std::int8_t>{1,1,1,1,1}))","4.0",VVar4,4.0);
        if ((pointer)local_568._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_568._0_8_,local_558._0_8_ - local_568._0_8_);
        }
        if ((string)local_5e0[0] == (string)0x0) {
          testing::Message::Message((Message *)local_568);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_5e0._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,0x65,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_498._M_first,(Message *)local_568);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
          if ((pointer)local_568._0_8_ != (pointer)0x0) {
            (**(code **)(*(long *)local_568._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_5e0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5e0._8_8_);
        }
        local_498._0_5_ = 0x1010101ff;
        __l_18._M_len = 5;
        __l_18._M_array = (iterator)&local_498;
        std::vector<signed_char,_std::allocator<signed_char>_>::vector
                  ((vector<signed_char,_std::allocator<signed_char>_> *)local_568,__l_18,
                   (allocator_type *)local_368);
        VVar4 = graph::IsingPolynomialModel<double>::CalculateEnergy
                          ((IsingPolynomialModel<double> *)local_408,
                           (vector<signed_char,_std::allocator<signed_char>_> *)local_568);
        testing::internal::CmpHelperFloatingPointEQ<double>
                  ((internal *)local_5e0,
                   "bpm.CalculateEnergy((std::vector<std::int8_t>{-1,1,1,1,1}))","1.0",VVar4,1.0);
        if ((pointer)local_568._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_568._0_8_,local_558._0_8_ - local_568._0_8_);
        }
        if ((string)local_5e0[0] == (string)0x0) {
          testing::Message::Message((Message *)local_568);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar15 = "";
          }
          else {
            pcVar15 = *(char **)local_5e0._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_498._M_first,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/graph/ising_polynomial_model.hpp"
                     ,0x66,pcVar15);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_498._M_first,(Message *)local_568);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
          if ((pointer)local_568._0_8_ != (pointer)0x0) {
            (**(code **)(*(long *)local_568._0_8_ + 8))();
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(local_5e0 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_5e0._8_8_);
        }
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&local_398);
        std::
        vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
        ::~vector(&local_3b0);
        std::
        _Hashtable<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>,_std::allocator<std::pair<const_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_openjij::utility::IndexHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&local_3e8);
        std::
        vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::~vector((vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   *)(local_408 + 8));
        pvVar7 = (void *)CONCAT44(local_120._4_4_,local_120._M_first._M_storage);
        if (pvVar7 != (void *)0x0) {
          operator_delete(pvVar7,local_120._16_8_ - (long)pvVar7);
        }
        std::
        vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
        ::~vector(&local_138);
        return;
      }
      uVar14 = 1;
      goto LAB_001386b5;
    }
  }
  uVar14 = 4;
LAB_001386b5:
  uVar14 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                      uVar14);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_498._M_first);
  if ((pointer)local_568._0_8_ != (pointer)0x0) {
    (**(code **)(*(long *)local_568._0_8_ + 8))();
  }
  local_568._0_8_ = (pointer)0x0;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_5e0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_5e0._8_8_);
  }
  local_5e0._8_8_ = 0;
  graph::IsingPolynomialModel<double>::~IsingPolynomialModel
            ((IsingPolynomialModel<double> *)local_408);
  pvVar7 = (void *)CONCAT44(local_120._4_4_,local_120._M_first._M_storage);
  if (pvVar7 != (void *)0x0) {
    operator_delete(pvVar7,local_120._16_8_ - (long)pvVar7);
  }
  std::
  vector<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>,_std::allocator<std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>_>_>
  ::~vector(&local_138);
  _Unwind_Resume(uVar14);
}

Assistant:

TEST(Graph, IsingPolynomialModel_1) {
   
   using FloatType = double;
   using Tup = utility::AnyTupleType;
   using IPM = graph::IsingPolynomialModel<FloatType>;
   
   std::vector<std::vector<typename IPM::IndexType>> key_list = {
      {1, 1, 1},
      {"a", "a", "a"},
      {Tup{2, "b"}, Tup{2, "b"}, Tup{2, "b"}},
      {1, 2},
      {"a", 1},
      {Tup{2, "b"}, Tup{2, "a"}}
   };
      
   std::vector<FloatType> value_list = {
      +4.0,
      +2.0,
      +3.0,
      -1.0,
      -1.5,
      -2.5
   };
   
   const auto bpm = IPM{key_list, value_list};
   
   EXPECT_EQ(bpm.GetDegree(), 2);
   EXPECT_EQ(bpm.GetSystemSize(), 5);
   EXPECT_EQ(bpm.GetIndexList(),
             (std::vector<IPM::IndexType>{1, 2, "a", Tup{2, "a"}, Tup{2, "b"}}));
   EXPECT_EQ(bpm.GetIndexMap().size(), 5);
   EXPECT_EQ(bpm.GetIndexMap().at(1)          , 0);
   EXPECT_EQ(bpm.GetIndexMap().at(2)          , 1);
   EXPECT_EQ(bpm.GetIndexMap().at("a")        , 2);
   EXPECT_EQ(bpm.GetIndexMap().at(Tup{2, "a"}), 3);
   EXPECT_EQ(bpm.GetIndexMap().at(Tup{2, "b"}), 4);
   
   EXPECT_EQ(bpm.GetKeyValueList().size(), 6);
   EXPECT_EQ(bpm.GetKeyValueList().at(0).first.size(), 1);
   EXPECT_EQ(bpm.GetKeyValueList().at(1).first.size(), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(2).first.size(), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(3).first.size(), 1);
   EXPECT_EQ(bpm.GetKeyValueList().at(4).first.size(), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(5).first.size(), 1);
   
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(0).second, +4.0);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(1).second, -1.0);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(2).second, -1.5);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(3).second, +2.0);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(4).second, -2.5);
   EXPECT_DOUBLE_EQ(bpm.GetKeyValueList().at(5).second, +3.0);
   
   EXPECT_EQ(bpm.GetKeyValueList().at(0).first.at(0), 0);
   EXPECT_EQ(bpm.GetKeyValueList().at(1).first.at(0), 0);
   EXPECT_EQ(bpm.GetKeyValueList().at(1).first.at(1), 1);
   EXPECT_EQ(bpm.GetKeyValueList().at(2).first.at(0), 0);
   EXPECT_EQ(bpm.GetKeyValueList().at(2).first.at(1), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(3).first.at(0), 2);
   EXPECT_EQ(bpm.GetKeyValueList().at(4).first.at(0), 3);
   EXPECT_EQ(bpm.GetKeyValueList().at(4).first.at(1), 4);
   EXPECT_EQ(bpm.GetKeyValueList().at(5).first.at(0), 4);
   
   EXPECT_EQ(bpm.GetAdjacencyList().size(), 5);
   EXPECT_EQ(bpm.GetAdjacencyList().at(0).size(), 3);
   EXPECT_EQ(bpm.GetAdjacencyList().at(0).at(0), 0);
   EXPECT_EQ(bpm.GetAdjacencyList().at(0).at(1), 1);
   EXPECT_EQ(bpm.GetAdjacencyList().at(0).at(2), 2);
   EXPECT_EQ(bpm.GetAdjacencyList().at(1).size(), 1);
   EXPECT_EQ(bpm.GetAdjacencyList().at(1).at(0), 1);
   EXPECT_EQ(bpm.GetAdjacencyList().at(2).size(), 2);
   EXPECT_EQ(bpm.GetAdjacencyList().at(2).at(0), 2);
   EXPECT_EQ(bpm.GetAdjacencyList().at(2).at(1), 3);
   EXPECT_EQ(bpm.GetAdjacencyList().at(3).size(), 1);
   EXPECT_EQ(bpm.GetAdjacencyList().at(3).at(0), 4);
   EXPECT_EQ(bpm.GetAdjacencyList().at(4).size(), 2);
   EXPECT_EQ(bpm.GetAdjacencyList().at(4).at(0), 4);
   EXPECT_EQ(bpm.GetAdjacencyList().at(4).at(1), 5);

   EXPECT_DOUBLE_EQ(bpm.GetEstimatedMinEnergyDifference(), 1.0*2);
   EXPECT_DOUBLE_EQ(bpm.GetEstimatedMaxEnergyDifference(), 6.5*2);
   
   EXPECT_DOUBLE_EQ(bpm.CalculateEnergy((std::vector<std::int8_t>{1,1,1,1,1})), 4.0);
   EXPECT_DOUBLE_EQ(bpm.CalculateEnergy((std::vector<std::int8_t>{-1,1,1,1,1})), 1.0);
   
}